

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QString>::QList<QLatin1String,void>(QList<QString> *this,QLatin1String *str)

{
  long lVar1;
  QArrayDataPointer<QString> *in_RDI;
  long in_FS_OFFSET;
  QList<QString> *this_00;
  QArrayDataPointer<QString> *this_01;
  QLatin1StringView in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  QArrayDataPointer<QString>::QArrayDataPointer(in_RDI);
  this_00 = (QList<QString> *)&stack0xffffffffffffffe0;
  QString::QString((QString *)this_01,in_stack_ffffffffffffffe0);
  append(this_00,(rvalue_ref)in_RDI);
  QString::~QString((QString *)0xaae09c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline explicit QList(const String &str)
    { append(str); }